

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http2.c
# Opt level: O0

int h2_process_pending_input(Curl_easy *data,http_conn *httpc,CURLcode *err)

{
  int iVar1;
  size_t inlen;
  size_t sVar2;
  char *pcVar3;
  HTTP *stream;
  ssize_t rv;
  char *inbuf;
  ssize_t nread;
  CURLcode *err_local;
  http_conn *httpc_local;
  Curl_easy *data_local;
  
  inlen = httpc->inbuflen - httpc->nread_inbuf;
  pcVar3 = httpc->inbuf;
  sVar2 = httpc->nread_inbuf;
  set_transfer(httpc,data);
  sVar2 = nghttp2_session_mem_recv(httpc->h2,(uint8_t *)(pcVar3 + sVar2),inlen);
  if ((long)sVar2 < 0) {
    pcVar3 = nghttp2_strerror((int)sVar2);
    Curl_failf(data,"h2_process_pending_input: nghttp2_session_mem_recv() returned %zd:%s",sVar2,
               pcVar3);
    *err = CURLE_RECV_ERROR;
    data_local._4_4_ = -1;
  }
  else {
    if (inlen == sVar2) {
      httpc->inbuflen = 0;
      httpc->nread_inbuf = 0;
    }
    else {
      httpc->nread_inbuf = sVar2 + httpc->nread_inbuf;
    }
    iVar1 = h2_session_send(data,httpc->h2);
    if (iVar1 == 0) {
      iVar1 = nghttp2_session_check_request_allowed(httpc->h2);
      if (iVar1 == 0) {
        Curl_conncontrol(data->conn,1);
      }
      iVar1 = should_close_session(httpc);
      if (iVar1 == 0) {
        data_local._4_4_ = 0;
      }
      else {
        if (((data->req).p.http)->error == 0) {
          Curl_conncontrol(data->conn,1);
          *err = CURLE_OK;
        }
        else {
          *err = CURLE_HTTP2;
        }
        data_local._4_4_ = -1;
      }
    }
    else {
      *err = CURLE_SEND_ERROR;
      data_local._4_4_ = -1;
    }
  }
  return data_local._4_4_;
}

Assistant:

static int h2_process_pending_input(struct Curl_easy *data,
                                    struct http_conn *httpc,
                                    CURLcode *err)
{
  ssize_t nread;
  char *inbuf;
  ssize_t rv;

  nread = httpc->inbuflen - httpc->nread_inbuf;
  inbuf = httpc->inbuf + httpc->nread_inbuf;

  set_transfer(httpc, data); /* set the transfer */
  rv = nghttp2_session_mem_recv(httpc->h2, (const uint8_t *)inbuf, nread);
  if(rv < 0) {
    failf(data,
          "h2_process_pending_input: nghttp2_session_mem_recv() returned "
          "%zd:%s", rv, nghttp2_strerror((int)rv));
    *err = CURLE_RECV_ERROR;
    return -1;
  }

  if(nread == rv) {
    H2BUGF(infof(data,
                 "h2_process_pending_input: All data in connection buffer "
                 "processed"));
    httpc->inbuflen = 0;
    httpc->nread_inbuf = 0;
  }
  else {
    httpc->nread_inbuf += rv;
    H2BUGF(infof(data,
                 "h2_process_pending_input: %zu bytes left in connection "
                 "buffer",
                 httpc->inbuflen - httpc->nread_inbuf));
  }

  rv = h2_session_send(data, httpc->h2);
  if(rv) {
    *err = CURLE_SEND_ERROR;
    return -1;
  }

  if(nghttp2_session_check_request_allowed(httpc->h2) == 0) {
    /* No more requests are allowed in the current session, so
       the connection may not be reused. This is set when a
       GOAWAY frame has been received or when the limit of stream
       identifiers has been reached. */
    connclose(data->conn, "http/2: No new requests allowed");
  }

  if(should_close_session(httpc)) {
    struct HTTP *stream = data->req.p.http;
    H2BUGF(infof(data,
                 "h2_process_pending_input: nothing to do in this session"));
    if(stream->error)
      *err = CURLE_HTTP2;
    else {
      /* not an error per se, but should still close the connection */
      connclose(data->conn, "GOAWAY received");
      *err = CURLE_OK;
    }
    return -1;
  }
  return 0;
}